

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O3

int __thiscall S2LaxPolygonShape::num_loop_vertices(S2LaxPolygonShape *this,int i)

{
  int iVar1;
  S2LogMessage SStack_18;
  
  iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
  if (i < iVar1) {
    if (iVar1 == 1) {
      iVar1 = (this->field_2).num_vertices_;
    }
    else {
      iVar1 = (this->field_2).cumulative_vertices_[(long)i + 1] -
              (this->field_2).cumulative_vertices_[i];
    }
    return iVar1;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
             ,0x70,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (i) < (num_loops()) ",0x22);
  abort();
}

Assistant:

S2LaxPolygonShape::~S2LaxPolygonShape() {
  if (num_loops() > 1) {
    delete[] cumulative_vertices_;
  }
}